

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

Kit_Node_t * Kit_GraphNodeFanin1(Kit_Graph_t *pGraph,Kit_Node_t *pNode)

{
  int iVar1;
  Kit_Node_t *local_20;
  Kit_Node_t *pNode_local;
  Kit_Graph_t *pGraph_local;
  
  iVar1 = Kit_GraphNodeIsVar(pGraph,pNode);
  if (iVar1 == 0) {
    local_20 = Kit_GraphNode(pGraph,(uint)pNode->eEdge1 >> 1 & 0x3fffffff);
  }
  else {
    local_20 = (Kit_Node_t *)0x0;
  }
  return local_20;
}

Assistant:

static inline Kit_Node_t * Kit_GraphNodeFanin1( Kit_Graph_t * pGraph, Kit_Node_t * pNode ){ return Kit_GraphNodeIsVar(pGraph, pNode)? NULL : Kit_GraphNode(pGraph, pNode->eEdge1.Node);     }